

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

ssize_t __thiscall Process::write(Process *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  
  sVar1 = ::write(this->fdStdInWrite,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
  return sVar1;
}

Assistant:

ssize Process::write(const void* buffer, usize len)
{
#ifdef _WIN32
  DWORD i;
#ifdef _AMD64
  const byte* bufferStart = (const byte*)buffer;
  while(len > (usize)INT_MAX)
  {
    if(!WriteFile(hStdInWrite, buffer, INT_MAX, &i, NULL))
      return -1;
    buffer = (const byte*)buffer + i;
    if(i != INT_MAX)
      return (const byte*)buffer - bufferStart;
    len -= INT_MAX;
  }
  if(!WriteFile(hStdInWrite, buffer, (DWORD)len, &i, NULL))
    return -1;
  buffer = (const byte*)buffer + i;
  return (const byte*)buffer - bufferStart;
#else
  if(!WriteFile(hStdInWrite, buffer, len, &i, NULL))
    return -1;
  return i;
#endif
#else
  return ::write(fdStdInWrite, buffer, len);
#endif
}